

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O3

int nacm_cardinality(lys_ext_instance *ext)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  lys_ext *plVar4;
  lys_ext_instance *plVar5;
  ulong uVar6;
  void *__ptr;
  byte bVar7;
  ulong uVar8;
  
  uVar2._0_2_ = ext->flags;
  uVar2._2_1_ = ext->ext_size;
  uVar2._3_1_ = ext->insubstmt_index;
  if ((uVar2 >> 8 & 1) == 0) {
    uVar6 = (ulong)*(byte *)((long)ext->parent + 0x1a);
    if (uVar6 != 0) {
      lVar3 = *(long *)((long)ext->parent + 0x20);
      plVar4 = ext->def;
      uVar8 = 0;
      bVar7 = 0;
      do {
        plVar5 = *(lys_ext_instance **)(lVar3 + uVar8 * 8);
        if (plVar5->def == plVar4) {
          if (plVar5 != ext) {
            pbVar1 = (byte *)((long)&plVar5->flags + 1);
            *pbVar1 = *pbVar1 | 1;
          }
          bVar7 = bVar7 + 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      if (1 < bVar7) {
        __ptr = (void *)lys_path();
        lyext_log(0,"NACM","nacm_cardinality",
                  "Extension nacm:%s can appear only once, but %d instances found in %s.",
                  ext->def->name,bVar7,__ptr);
        free(__ptr);
        return 1;
      }
    }
  }
  else {
    ext->flags = (undefined2)uVar2 & 0xfeff;
  }
  return 0;
}

Assistant:

int
nacm_cardinality(struct lys_ext_instance *ext)
{
    struct lys_ext_instance **extlist;
    uint8_t extsize, i, c;
    char *path;

    if (ext->flags & LYEXT_OPT_PLUGIN1) {
        /* already checked */
        ext->flags &= ~LYEXT_OPT_PLUGIN1;
        return 0;
    }

    extlist = ((struct lys_node *)ext->parent)->ext;
    extsize = ((struct lys_node *)ext->parent)->ext_size;

    for (i = c = 0; i < extsize; i++) {
        if (extlist[i]->def == ext->def) {
            /* note, that it is not necessary to check also ext->insubstmt since
             * nacm_position() ensures that NACM's extension instances are placed only
             * in schema nodes */
            if (extlist[i] != ext) {
                /* do not mark the instance being checked */
                extlist[i]->flags |= LYEXT_OPT_PLUGIN1;
            }
            c++;
        }
    }

    if (c > 1) {
        path = lys_path((struct lys_node *)(ext->parent));
        LYEXT_LOG(LY_LLERR, "NACM", "Extension nacm:%s can appear only once, but %d instances found in %s.",
                  ext->def->name, c, path);
        free(path);
        return 1;
    } else {
        return 0;
    }
}